

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.hpp
# Opt level: O2

void __thiscall
ranges::
join_view<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>_>
::cursor<false>::cursor(cursor<false> *this,cursor<false> *param_2)

{
  Parent *pPVar1;
  undefined8 uVar2;
  box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
  bVar3;
  ulong uVar4;
  
  pPVar1 = param_2->rng_;
  uVar2 = *(undefined8 *)
           &(param_2->outer_it_).
            super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
            .
            super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
            .
            super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
            .
            super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
            .value;
  bVar3.value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>,_2>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (((_Head_base<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,_false>
          *)((long)&(param_2->outer_it_).
                    super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
                    .
                    super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                    .
                    super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                    .value.its_ + 8))->_M_head_impl).
       super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
       .
       super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void>
       .
       super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
       .
       super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
       .
       super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
       .value;
  (this->outer_it_).
  super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
  .
  super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.its_.
  super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  .
  super__Head_base<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
  ._M_head_impl._M_current =
       (param_2->outer_it_).
       super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
       .
       super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
       .
       super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
       .
       super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
       .value.its_.
       super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
       .
       super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
       .
       super__Head_base<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
       ._M_head_impl._M_current;
  (((_Head_base<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,_false>
     *)((long)&(this->outer_it_).
               super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
               .
               super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
               .
               super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
               .
               super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
               .value.its_ + 8))->_M_head_impl).
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
  .value = bVar3.value.
           super_adaptor_value_type_<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>,_2>
           .data_.
           super_box<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
           .value._M_current;
  this->rng_ = pPVar1;
  *(undefined8 *)
   &(this->outer_it_).
    super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
    .
    super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
    .
    super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
    .
    super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
    .value = uVar2;
  (this->inner_it_).
  super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
  .
  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
  .
  super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
  .
  super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
  .value.rng_ = (param_2->inner_it_).
                super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                .
                super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
                .
                super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                .
                super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                .value.rng_;
  uVar4 = *(size_t *)
           ((long)&(param_2->inner_it_).
                   super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                   .
                   super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
                   .
                   super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                   .
                   super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                   .value.its_ + 8);
  if (uVar4 < 2) {
    (this->inner_it_).
    super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
    .
    super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
    .
    super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
    .
    super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
    .value.its_.
    super_variant_data<double_*,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>.
    field_0 = (param_2->inner_it_).
              super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
              .
              super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
              .
              super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
              .
              super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
              .value.its_.
              super_variant_data<double_*,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>
              .field_0;
  }
  else {
    uVar4 = 2;
  }
  *(ulong *)((long)&(this->inner_it_).
                    super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                    .
                    super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
                    .
                    super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                    .
                    super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                    .value.its_ + 8) = uVar4;
  return;
}

Assistant:

struct cursor
        {
        private:
            using Parent = meta::conditional_t<Const, join_view const, join_view>;
            using COuter = meta::conditional_t<Const, Rng const, Rng>;
            using CInner = range_reference_t<COuter>;
            using ref_is_glvalue = std::is_reference<CInner>;

            Parent * rng_ = nullptr;
            iterator_t<COuter> outer_it_{};
            iterator_t<CInner> inner_it_{};

            void satisfy()
            {
                for(; outer_it_ != ranges::end(rng_->outer_); ++outer_it_)
                {
                    auto & inner = rng_->update_inner_(*outer_it_);
                    inner_it_ = ranges::begin(inner);
                    if(inner_it_ != ranges::end(inner))
                        return;
                }
                if(RANGES_CONSTEXPR_IF(ref_is_glvalue::value))
                    inner_it_ = iterator_t<CInner>();
            }

        public:
            using single_pass = meta::bool_<single_pass_iterator_<iterator_t<COuter>> ||
                                            single_pass_iterator_<iterator_t<CInner>> ||
                                            !ref_is_glvalue::value>;
            cursor() = default;
            template<typename BeginOrEnd>
            constexpr cursor(Parent * rng, BeginOrEnd begin_or_end)
              : rng_{rng}
              , outer_it_(begin_or_end(rng->outer_))
            {
                satisfy();
            }
            template(bool Other)(
                /// \pre
                requires Const AND CPP_NOT(Other) AND
                convertible_to<iterator_t<Rng>, iterator_t<COuter>> AND
                convertible_to<iterator_t<range_reference_t<Rng>>,
                               iterator_t<CInner>>)
            constexpr cursor(cursor<Other> that)
              : rng_(that.rng_)
              , outer_it_(std::move(that.outer_it_))
              , inner_it_(std::move(that.inner_it_))
            {}
            CPP_member
            constexpr auto arrow() //
                -> CPP_ret(iterator_t<CInner>)(
                    /// \pre
                    requires detail::has_arrow_<iterator_t<CInner>>)
            {
                return inner_it_;
            }
            constexpr bool equal(default_sentinel_t) const
            {
                return outer_it_ == ranges::end(rng_->outer_);
            }
            CPP_member
            constexpr auto equal(cursor const & that) const //
                -> CPP_ret(bool)(
                    /// \pre
                    requires ref_is_glvalue::value && //
                        equality_comparable<iterator_t<COuter>> && //
                        equality_comparable<iterator_t<CInner>>)
            {
                return outer_it_ == that.outer_it_ && inner_it_ == that.inner_it_;
            }
            constexpr void next()
            {
                auto && inner_rng = rng_->get_inner_(outer_it_);
                if(++inner_it_ == ranges::end(inner_rng))
                {
                    ++outer_it_;
                    satisfy();
                }
            }
            CPP_member
            constexpr auto prev() //
                -> CPP_ret(void)(
                    /// \pre
                    requires ref_is_glvalue::value && //
                        bidirectional_range<COuter> && //
                        bidirectional_range<CInner> && //
                        common_range<CInner>) // ericniebler/stl2#606
            {
                if(outer_it_ == ranges::end(rng_->outer_))
                    inner_it_ = ranges::end(*--outer_it_);
                while(inner_it_ == ranges::begin(*outer_it_))
                    inner_it_ = ranges::end(*--outer_it_);
                --inner_it_;
            }
            // clang-format off
            constexpr auto CPP_auto_fun(read)()(const)
            (
                return *inner_it_
            )
            constexpr auto CPP_auto_fun(move)()(const)
            (
                return iter_move(inner_it_)
            )
            // clang-format on
        };
        static constexpr bool use_const_always() noexcept
        {
            return simple_view<Rng>() && std::is_reference<range_reference_t<Rng>>::value;
        }
        struct end_cursor_fn
        {
            constexpr auto operator()(join_view * this_, std::true_type) const
            {
                return cursor<use_const_always()>{this_, ranges::end};
            }
            constexpr auto operator()(join_view *, std::false_type) const
            {
                return default_sentinel_t{};
            }
        };
        struct cend_cursor_fn
        {
            constexpr auto operator()(join_view const * this_, std::true_type) const
            {
                return cursor<true>{this_, ranges::end};
            }
            constexpr auto operator()(join_view const *, std::false_type) const
            {
                return default_sentinel_t{};
            }
        };

        constexpr cursor<use_const_always()> begin_cursor()
        {
            return {this, ranges::begin};
        }

        template(bool Const = true)(
            /// \pre
            requires Const AND input_range<meta::const_if_c<Const, Rng>> AND
                std::is_reference<range_reference_t<meta::const_if_c<Const, Rng>>>::value)
        constexpr cursor<Const> begin_cursor() const
        {
            return {this, ranges::begin};
        }

        constexpr auto end_cursor()
        {
            using cond =
                meta::bool_<std::is_reference<range_reference_t<Rng>>::value &&
                            forward_range<Rng> && forward_range<range_reference_t<Rng>> &&
                            common_range<Rng> && common_range<range_reference_t<Rng>>>;
            return end_cursor_fn{}(this, cond{});
        }